

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

BlockRef * __thiscall
node::anon_unknown_2::MinerImpl::waitTipChanged
          (BlockRef *__return_storage_ptr__,MinerImpl *this,uint256 current_tip,
          MillisecondsDouble timeout)

{
  KernelNotifications *pKVar1;
  uint256 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_> *puVar8;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar9;
  Chainstate *pCVar10;
  unique_lock<std::recursive_mutex> *__atime;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  mutex_type *pmVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  undefined1 local_70 [8];
  unique_lock<std::mutex> local_68;
  unique_lock<std::recursive_mutex> local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = std::chrono::_V2::steady_clock::now();
  pmVar12 = (mutex_type *)(timeout.__r * 1000000.0 + (double)lVar7);
  local_70 = (undefined1  [8])(mutex_type *)0x43e0000000000000;
  if ((double)lVar7 <= (double)pmVar12) {
    local_70 = (undefined1  [8])pmVar12;
  }
  puVar8 = inline_assertion_check<true,std::unique_ptr<node::KernelNotifications,std::default_delete<node::KernelNotifications>>&>
                     (&this->m_node->notifications,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                      ,0x3e0,"notifications","m_node.notifications");
  local_68._M_device =
       &(((puVar8->_M_t).
          super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
          ._M_t.
          super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
          .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl)->
        m_tip_block_mutex).super_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_68);
  do {
    puVar8 = inline_assertion_check<true,std::unique_ptr<node::KernelNotifications,std::default_delete<node::KernelNotifications>>&>
                       (&this->m_node->notifications,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                        ,0x3e0,"notifications","m_node.notifications");
    pKVar1 = (puVar8->_M_t).
             super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
             ._M_t.
             super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
             .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl;
    local_48 = (undefined1  [16])0x0;
    local_58._M_device = (mutex_type *)0x0;
    local_58._M_owns = false;
    local_58._9_7_ = 0;
    auVar13[0] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x10) == '\0' &&
                  *(char *)&(pKVar1->m_tip_block).super_base_blob<256U>.m_data == '\0');
    auVar13[1] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x11) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 1) == '\0');
    auVar13[2] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x12) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 2) == '\0');
    auVar13[3] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x13) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 3) == '\0');
    auVar13[4] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x14) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 4) == '\0');
    auVar13[5] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x15) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 5) == '\0');
    auVar13[6] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x16) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 6) == '\0');
    auVar13[7] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x17) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 7) == '\0');
    auVar13[8] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x18) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 8) == '\0');
    auVar13[9] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x19) == '\0' &&
                  *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 9) == '\0');
    auVar13[10] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1a) == '\0' &&
                   *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 10) == '\0');
    auVar13[0xb] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1b) == '\0'
                    && *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xb) == '\0')
    ;
    auVar13[0xc] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1c) == '\0'
                    && *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xc) == '\0')
    ;
    auVar13[0xd] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1d) == '\0'
                    && *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xd) == '\0')
    ;
    auVar13[0xe] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1e) == '\0'
                    && *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xe) == '\0')
    ;
    auVar13[0xf] = -(*(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1f) == '\0'
                    && *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xf) == '\0')
    ;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) != 0xffff) {
      puVar8 = inline_assertion_check<true,std::unique_ptr<node::KernelNotifications,std::default_delete<node::KernelNotifications>>&>
                         (&this->m_node->notifications,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                          ,0x3e0,"notifications","m_node.notifications");
      pKVar1 = (puVar8->_M_t).
               super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
               ._M_t.
               super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
               .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl;
      auVar14[0] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0] ==
                    (pKVar1->m_tip_block).super_base_blob<256U>.m_data._M_elems[0]);
      auVar14[1] = -(current_tip.super_base_blob<256U>.m_data._M_elems[1] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 1));
      auVar14[2] = -(current_tip.super_base_blob<256U>.m_data._M_elems[2] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 2));
      auVar14[3] = -(current_tip.super_base_blob<256U>.m_data._M_elems[3] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 3));
      auVar14[4] = -(current_tip.super_base_blob<256U>.m_data._M_elems[4] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 4));
      auVar14[5] = -(current_tip.super_base_blob<256U>.m_data._M_elems[5] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 5));
      auVar14[6] = -(current_tip.super_base_blob<256U>.m_data._M_elems[6] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 6));
      auVar14[7] = -(current_tip.super_base_blob<256U>.m_data._M_elems[7] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 7));
      auVar14[8] = -(current_tip.super_base_blob<256U>.m_data._M_elems[8] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 8));
      auVar14[9] = -(current_tip.super_base_blob<256U>.m_data._M_elems[9] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 9));
      auVar14[10] = -(current_tip.super_base_blob<256U>.m_data._M_elems[10] ==
                     *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 10));
      auVar14[0xb] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xb));
      auVar14[0xc] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xc));
      auVar14[0xd] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xd));
      auVar14[0xe] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xe));
      auVar14[0xf] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0xf));
      auVar11[0] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x10] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x10));
      auVar11[1] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x11] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x11));
      auVar11[2] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x12] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x12));
      auVar11[3] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x13] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x13));
      auVar11[4] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x14] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x14));
      auVar11[5] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x15] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x15));
      auVar11[6] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x16] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x16));
      auVar11[7] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x17] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x17));
      auVar11[8] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x18] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x18));
      auVar11[9] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x19] ==
                    *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x19));
      auVar11[10] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1a));
      auVar11[0xb] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1b));
      auVar11[0xc] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1c));
      auVar11[0xd] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1d));
      auVar11[0xe] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1e));
      auVar11[0xf] = -(current_tip.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      *(uchar *)((long)&(pKVar1->m_tip_block).super_base_blob<256U> + 0x1f));
      auVar11 = auVar11 & auVar14;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
LAB_00959de5:
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        local_58._0_9_ = ZEXT89(0x139c540);
        std::unique_lock<std::recursive_mutex>::lock(&local_58);
        puVar9 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                           (&this->m_node->chainman,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                            ,0x3df,"chainman","m_node.chainman");
        pCVar10 = ChainstateManager::ActiveChainstate
                            ((puVar9->_M_t).
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        puVar2 = (pCVar10->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->phashBlock;
        if (puVar2 == (uint256 *)0x0) {
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        uVar3 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
        uVar4 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
        uVar5 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
        *(undefined8 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0x10)
             = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
        *(undefined8 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 0x18)
             = uVar5;
        *(undefined8 *)(__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems = uVar3;
        *(undefined8 *)((__return_storage_ptr__->hash).super_base_blob<256U>.m_data._M_elems + 8) =
             uVar4;
        puVar9 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                           (&this->m_node->chainman,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                            ,0x3df,"chainman","m_node.chainman");
        pCVar10 = ChainstateManager::ActiveChainstate
                            ((puVar9->_M_t).
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        __return_storage_ptr__->height =
             (pCVar10->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->nHeight;
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
        __stack_chk_fail();
      }
    }
    puVar9 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&this->m_node->chainman,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                        ,0x3df,"chainman","m_node.chainman");
    bVar6 = util::SignalInterrupt::operator_cast_to_bool
                      (((puVar9->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                       m_interrupt);
    if (bVar6) goto LAB_00959de5;
    lVar7 = std::chrono::_V2::steady_clock::now();
    if ((double)local_70 <= (double)lVar7) goto LAB_00959de5;
    puVar8 = inline_assertion_check<true,std::unique_ptr<node::KernelNotifications,std::default_delete<node::KernelNotifications>>&>
                       (&this->m_node->notifications,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                        ,0x3e0,"notifications","m_node.notifications");
    pmVar12 = (mutex_type *)((double)lVar7 + 1000000000.0);
    local_58._M_device = pmVar12;
    __atime = (unique_lock<std::recursive_mutex> *)local_70;
    if ((double)pmVar12 < (double)local_70) {
      __atime = &local_58;
    }
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
              (&((puVar8->_M_t).
                 super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
                 .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl)->
                m_tip_block_cv,&local_68,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)__atime);
  } while( true );
}

Assistant:

BlockRef waitTipChanged(uint256 current_tip, MillisecondsDouble timeout) override
    {
        // Interrupt check interval
        const MillisecondsDouble tick{1000};
        auto now{std::chrono::steady_clock::now()};
        auto deadline = now + timeout;
        // std::chrono does not check against overflow
        if (deadline < now) deadline = std::chrono::steady_clock::time_point::max();
        {
            WAIT_LOCK(notifications().m_tip_block_mutex, lock);
            while ((notifications().m_tip_block == uint256() || notifications().m_tip_block == current_tip) && !chainman().m_interrupt) {
                now = std::chrono::steady_clock::now();
                if (now >= deadline) break;
                notifications().m_tip_block_cv.wait_until(lock, std::min(deadline, now + tick));
            }
        }
        // Must release m_tip_block_mutex before locking cs_main, to avoid deadlocks.
        LOCK(::cs_main);
        return BlockRef{chainman().ActiveChain().Tip()->GetBlockHash(), chainman().ActiveChain().Tip()->nHeight};
    }